

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void rule_print(FILE *out,rule *rp)

{
  symbol *psVar1;
  long lVar2;
  long lVar3;
  
  fputs(rp->lhs->name,(FILE *)out);
  fwrite(" ::=",4,1,(FILE *)out);
  if (0 < rp->nrhs) {
    lVar2 = 0;
    do {
      psVar1 = rp->rhs[lVar2];
      if (psVar1->type == MULTITERMINAL) {
        fprintf((FILE *)out," %s",(*psVar1->subsym)->name);
        if (1 < psVar1->nsubsym) {
          lVar3 = 1;
          do {
            fprintf((FILE *)out,"|%s",psVar1->subsym[lVar3]->name);
            lVar3 = lVar3 + 1;
          } while (lVar3 < psVar1->nsubsym);
        }
      }
      else {
        fprintf((FILE *)out," %s",psVar1->name);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < rp->nrhs);
  }
  return;
}

Assistant:

void rule_print(FILE *out, struct rule *rp){
  int i, j;
  fprintf(out, "%s",rp->lhs->name);
  /*    if( rp->lhsalias ) fprintf(out,"(%s)",rp->lhsalias); */
  fprintf(out," ::=");
  for(i=0; i<rp->nrhs; i++){
    struct symbol *sp = rp->rhs[i];
    if( sp->type==MULTITERMINAL ){
      fprintf(out," %s", sp->subsym[0]->name);
      for(j=1; j<sp->nsubsym; j++){
        fprintf(out,"|%s", sp->subsym[j]->name);
      }
    }else{
      fprintf(out," %s", sp->name);
    }
    /* if( rp->rhsalias[i] ) fprintf(out,"(%s)",rp->rhsalias[i]); */
  }
}